

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O3

void __thiscall QVariantAnimationPrivate::QVariantAnimationPrivate(QVariantAnimationPrivate *this)

{
  QAbstractAnimationPrivate::QAbstractAnimationPrivate(&this->super_QAbstractAnimationPrivate);
  (this->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QVariantAnimationPrivate_0069dfa0;
  (this->currentValue).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->currentValue).d.data + 8) = 0;
  *(undefined8 *)((long)&(this->currentValue).d.data + 0x10) = 0;
  *(undefined8 *)&(this->currentValue).d.field_0x18 = 2;
  (this->defaultStartEndValue).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->defaultStartEndValue).d.data + 8) = 0;
  *(undefined8 *)((long)&(this->defaultStartEndValue).d.data + 0x10) = 0;
  *(undefined8 *)&(this->defaultStartEndValue).d.field_0x18 = 2;
  (this->currentInterval).start.first = 0.0;
  (this->currentInterval).start.second.d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->currentInterval).start.second.d.data + 8) = 0;
  *(undefined8 *)((long)&(this->currentInterval).start.second.d.data + 0x10) = 0;
  *(undefined8 *)&(this->currentInterval).start.second.d.field_0x18 = 2;
  (this->currentInterval).end.first = 0.0;
  (this->currentInterval).end.second.d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->currentInterval).end.second.d.data + 8) = 0;
  *(undefined8 *)((long)&(this->currentInterval).end.second.d.data + 0x10) = 0;
  *(undefined8 *)&(this->currentInterval).end.second.d.field_0x18 = 2;
  QEasingCurve::QEasingCurve((QEasingCurve *)&this->easing,Linear);
  (this->duration).super_QPropertyData<int>.val = 0xfa;
  (this->keyValues).d.d = (Data *)0x0;
  (this->keyValues).d.ptr = (pair<double,_QVariant> *)0x0;
  (this->keyValues).d.size = 0;
  this->interpolator = defaultInterpolator;
  return;
}

Assistant:

QVariantAnimationPrivate::QVariantAnimationPrivate() : duration(250), interpolator(&defaultInterpolator)
{ }